

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkwrite.c
# Opt level: O2

int mbedtls_pk_write_key_der(mbedtls_pk_context *key,uchar *buf,size_t size)

{
  mbedtls_rsa_context *ctx;
  mbedtls_ecp_keypair *ec;
  mbedtls_pk_type_t mVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  size_t sVar8;
  uchar *c;
  uint local_90;
  uint local_8c;
  mbedtls_mpi T;
  
  uVar2 = 0xffffff94;
  if (size != 0) {
    c = buf + size;
    mVar1 = mbedtls_pk_get_type(key);
    if (mVar1 == MBEDTLS_PK_RSA) {
      ctx = (mbedtls_rsa_context *)key->pk_ctx;
      mbedtls_mpi_init(&T);
      uVar7 = 0;
      uVar2 = mbedtls_rsa_export_crt(ctx,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,&T);
      if (uVar2 == 0) {
        uVar3 = mbedtls_asn1_write_mpi(&c,buf,&T);
        uVar7 = (ulong)uVar3;
        if ((int)uVar3 < 0) {
          uVar7 = 0;
          uVar2 = uVar3;
        }
        else {
          uVar2 = mbedtls_rsa_export_crt(ctx,(mbedtls_mpi *)0x0,&T,(mbedtls_mpi *)0x0);
          if ((uVar2 == 0) && (uVar2 = mbedtls_asn1_write_mpi(&c,buf,&T), -1 < (int)uVar2)) {
            uVar7 = (ulong)(uVar2 + uVar3);
            uVar2 = mbedtls_rsa_export_crt(ctx,&T,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0);
            if (uVar2 == 0) {
              uVar2 = mbedtls_asn1_write_mpi(&c,buf,&T);
              if (-1 < (int)uVar2) {
                uVar7 = uVar2 + uVar7;
                uVar2 = mbedtls_rsa_export(ctx,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,&T,
                                           (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0);
                if (uVar2 == 0) {
                  uVar2 = mbedtls_asn1_write_mpi(&c,buf,&T);
                  if (-1 < (int)uVar2) {
                    uVar7 = uVar7 + uVar2;
                    uVar2 = mbedtls_rsa_export(ctx,(mbedtls_mpi *)0x0,&T,(mbedtls_mpi *)0x0,
                                               (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0);
                    if (uVar2 == 0) {
                      uVar2 = mbedtls_asn1_write_mpi(&c,buf,&T);
                      if (-1 < (int)uVar2) {
                        uVar7 = uVar7 + uVar2;
                        uVar2 = mbedtls_rsa_export(ctx,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                                                   (mbedtls_mpi *)0x0,&T,(mbedtls_mpi *)0x0);
                        if (uVar2 == 0) {
                          uVar2 = mbedtls_asn1_write_mpi(&c,buf,&T);
                          if (-1 < (int)uVar2) {
                            uVar7 = uVar7 + uVar2;
                            uVar2 = mbedtls_rsa_export(ctx,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                                                       (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,&T);
                            if (uVar2 == 0) {
                              uVar2 = mbedtls_asn1_write_mpi(&c,buf,&T);
                              if (-1 < (int)uVar2) {
                                uVar7 = uVar7 + uVar2;
                                uVar2 = mbedtls_rsa_export(ctx,&T,(mbedtls_mpi *)0x0,
                                                           (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                                                           (mbedtls_mpi *)0x0);
                                if (uVar2 == 0) {
                                  uVar2 = mbedtls_asn1_write_mpi(&c,buf,&T);
                                  if (-1 < (int)uVar2) {
                                    uVar7 = uVar7 + uVar2;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      mbedtls_mpi_free(&T);
      if (-1 < (int)uVar2) {
        uVar3 = mbedtls_asn1_write_int(&c,buf,0);
        uVar2 = uVar3;
        if (-1 < (int)uVar3) {
          uVar4 = mbedtls_asn1_write_len(&c,buf,uVar7 + uVar3);
          uVar2 = uVar4;
          if ((-1 < (int)uVar4) && (uVar2 = mbedtls_asn1_write_tag(&c,buf,'0'), -1 < (int)uVar2)) {
            uVar2 = (int)(uVar7 + uVar3) + uVar2 + uVar4;
          }
        }
      }
    }
    else {
      mVar1 = mbedtls_pk_get_type(key);
      uVar2 = 0xffffc680;
      if (mVar1 == MBEDTLS_PK_ECKEY) {
        ec = (mbedtls_ecp_keypair *)key->pk_ctx;
        uVar3 = pk_write_ec_pubkey(&c,buf,ec);
        uVar2 = uVar3;
        if ((-1 < (int)uVar3) && (uVar2 = 0xffffff94, c != buf && -1 < (long)c - (long)buf)) {
          c[-1] = '\0';
          c = c + -1;
          uVar4 = mbedtls_asn1_write_len(&c,buf,(ulong)(uVar3 + 1));
          uVar2 = uVar4;
          if ((-1 < (int)uVar4) && (uVar2 = mbedtls_asn1_write_tag(&c,buf,'\x03'), -1 < (int)uVar2))
          {
            sVar8 = (ulong)(uVar3 + 1) + (ulong)uVar2 + (ulong)uVar4;
            uVar3 = mbedtls_asn1_write_len(&c,buf,sVar8);
            uVar2 = uVar3;
            if ((-1 < (int)uVar3) &&
               (uVar4 = mbedtls_asn1_write_tag(&c,buf,0xa1), uVar2 = uVar4, -1 < (int)uVar4)) {
              uVar5 = pk_write_ec_param(&c,buf,ec);
              uVar2 = uVar5;
              if ((-1 < (int)uVar5) &&
                 ((uVar6 = mbedtls_asn1_write_len(&c,buf,(ulong)uVar5), uVar2 = uVar6,
                  -1 < (int)uVar6 && (uVar2 = mbedtls_asn1_write_tag(&c,buf,0xa0), -1 < (int)uVar2))
                 )) {
                uVar7 = (ec->grp).pbits + 7 >> 3;
                local_90 = uVar2;
                local_8c = uVar5;
                uVar5 = mbedtls_mpi_write_binary(&ec->d,(uchar *)&T,uVar7);
                if (uVar5 == 0) {
                  uVar5 = mbedtls_asn1_write_octet_string(&c,buf,(uchar *)&T,uVar7);
                }
                mbedtls_platform_zeroize(&T,uVar7);
                uVar2 = uVar5;
                if ((-1 < (int)uVar5) && (uVar2 = mbedtls_asn1_write_int(&c,buf,1), -1 < (int)uVar2)
                   ) {
                  sVar8 = sVar8 + uVar3 + (ulong)local_90 + (ulong)(uVar6 + local_8c) + (ulong)uVar4
                          + (ulong)uVar5 + (ulong)uVar2;
                  uVar3 = mbedtls_asn1_write_len(&c,buf,sVar8);
                  uVar2 = uVar3;
                  if ((-1 < (int)uVar3) &&
                     (uVar2 = mbedtls_asn1_write_tag(&c,buf,'0'), -1 < (int)uVar2)) {
                    uVar2 = (int)sVar8 + uVar2 + uVar3;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

int mbedtls_pk_write_key_der( mbedtls_pk_context *key, unsigned char *buf, size_t size )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char *c;
    size_t len = 0;

    PK_VALIDATE_RET( key != NULL );
    if( size == 0 )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );
    PK_VALIDATE_RET( buf != NULL );

    c = buf + size;

#if defined(MBEDTLS_RSA_C)
    if( mbedtls_pk_get_type( key ) == MBEDTLS_PK_RSA )
    {
        mbedtls_mpi T; /* Temporary holding the exported parameters */
        mbedtls_rsa_context *rsa = mbedtls_pk_rsa( *key );

        /*
         * Export the parameters one after another to avoid simultaneous copies.
         */

        mbedtls_mpi_init( &T );

        /* Export QP */
        if( ( ret = mbedtls_rsa_export_crt( rsa, NULL, NULL, &T ) ) != 0 ||
            ( ret = mbedtls_asn1_write_mpi( &c, buf, &T ) ) < 0 )
            goto end_of_export;
        len += ret;

        /* Export DQ */
        if( ( ret = mbedtls_rsa_export_crt( rsa, NULL, &T, NULL ) ) != 0 ||
            ( ret = mbedtls_asn1_write_mpi( &c, buf, &T ) ) < 0 )
            goto end_of_export;
        len += ret;

        /* Export DP */
        if( ( ret = mbedtls_rsa_export_crt( rsa, &T, NULL, NULL ) ) != 0 ||
            ( ret = mbedtls_asn1_write_mpi( &c, buf, &T ) ) < 0 )
            goto end_of_export;
        len += ret;

        /* Export Q */
        if ( ( ret = mbedtls_rsa_export( rsa, NULL, NULL,
                                         &T, NULL, NULL ) ) != 0 ||
             ( ret = mbedtls_asn1_write_mpi( &c, buf, &T ) ) < 0 )
            goto end_of_export;
        len += ret;

        /* Export P */
        if ( ( ret = mbedtls_rsa_export( rsa, NULL, &T,
                                         NULL, NULL, NULL ) ) != 0 ||
             ( ret = mbedtls_asn1_write_mpi( &c, buf, &T ) ) < 0 )
            goto end_of_export;
        len += ret;

        /* Export D */
        if ( ( ret = mbedtls_rsa_export( rsa, NULL, NULL,
                                         NULL, &T, NULL ) ) != 0 ||
             ( ret = mbedtls_asn1_write_mpi( &c, buf, &T ) ) < 0 )
            goto end_of_export;
        len += ret;

        /* Export E */
        if ( ( ret = mbedtls_rsa_export( rsa, NULL, NULL,
                                         NULL, NULL, &T ) ) != 0 ||
             ( ret = mbedtls_asn1_write_mpi( &c, buf, &T ) ) < 0 )
            goto end_of_export;
        len += ret;

        /* Export N */
        if ( ( ret = mbedtls_rsa_export( rsa, &T, NULL,
                                         NULL, NULL, NULL ) ) != 0 ||
             ( ret = mbedtls_asn1_write_mpi( &c, buf, &T ) ) < 0 )
            goto end_of_export;
        len += ret;

    end_of_export:

        mbedtls_mpi_free( &T );
        if( ret < 0 )
            return( ret );

        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_int( &c, buf, 0 ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, buf, len ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c,
                                               buf, MBEDTLS_ASN1_CONSTRUCTED |
                                               MBEDTLS_ASN1_SEQUENCE ) );
    }
    else
#endif /* MBEDTLS_RSA_C */
#if defined(MBEDTLS_ECP_C)
    if( mbedtls_pk_get_type( key ) == MBEDTLS_PK_ECKEY )
    {
        mbedtls_ecp_keypair *ec = mbedtls_pk_ec( *key );
        size_t pub_len = 0, par_len = 0;

        /*
         * RFC 5915, or SEC1 Appendix C.4
         *
         * ECPrivateKey ::= SEQUENCE {
         *      version        INTEGER { ecPrivkeyVer1(1) } (ecPrivkeyVer1),
         *      privateKey     OCTET STRING,
         *      parameters [0] ECParameters {{ NamedCurve }} OPTIONAL,
         *      publicKey  [1] BIT STRING OPTIONAL
         *    }
         */

        /* publicKey */
        MBEDTLS_ASN1_CHK_ADD( pub_len, pk_write_ec_pubkey( &c, buf, ec ) );

        if( c - buf < 1 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );
        *--c = 0;
        pub_len += 1;

        MBEDTLS_ASN1_CHK_ADD( pub_len, mbedtls_asn1_write_len( &c, buf, pub_len ) );
        MBEDTLS_ASN1_CHK_ADD( pub_len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_BIT_STRING ) );

        MBEDTLS_ASN1_CHK_ADD( pub_len, mbedtls_asn1_write_len( &c, buf, pub_len ) );
        MBEDTLS_ASN1_CHK_ADD( pub_len, mbedtls_asn1_write_tag( &c, buf,
                            MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | 1 ) );
        len += pub_len;

        /* parameters */
        MBEDTLS_ASN1_CHK_ADD( par_len, pk_write_ec_param( &c, buf, ec ) );

        MBEDTLS_ASN1_CHK_ADD( par_len, mbedtls_asn1_write_len( &c, buf, par_len ) );
        MBEDTLS_ASN1_CHK_ADD( par_len, mbedtls_asn1_write_tag( &c, buf,
                            MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | 0 ) );
        len += par_len;

        /* privateKey */
        MBEDTLS_ASN1_CHK_ADD( len, pk_write_ec_private( &c, buf, ec ) );

        /* version */
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_int( &c, buf, 1 ) );

        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, buf, len ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                    MBEDTLS_ASN1_SEQUENCE ) );
    }
    else
#endif /* MBEDTLS_ECP_C */
        return( MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE );

    return( (int) len );
}